

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::TableLoadSettings(ImGuiTable *table)

{
  ImGuiContext *pIVar1;
  int iVar2;
  uint uVar3;
  ImGuiTableSettings *p;
  byte bVar4;
  ImGuiTableColumn *pIVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  byte *pbVar11;
  bool bVar12;
  uint uVar13;
  ulong uVar14;
  
  pIVar1 = GImGui;
  table->IsSettingsRequestLoad = false;
  if ((table->Flags & 0x10) == 0) {
    if (table->SettingsOffset == -1) {
      p = TableSettingsFindByID(table->ID);
      if (p == (ImGuiTableSettings *)0x0) {
        return;
      }
      if (table->ColumnsCount != (int)p->ColumnsCount) {
        table->IsSettingsDirty = true;
      }
      iVar2 = ImChunkStream<ImGuiTableSettings>::offset_from_ptr(&pIVar1->SettingsTables,p);
      table->SettingsOffset = iVar2;
    }
    else {
      p = TableGetBoundSettings(table);
    }
    table->SettingsLoadedFlags = p->SaveFlags;
    table->RefScale = p->RefScale;
    bVar4 = p->ColumnsCount;
    uVar3 = 0;
    if ((char)bVar4 < '\x01') {
      uVar7 = 0;
    }
    else {
      pbVar11 = (byte *)((long)&p[1].RefScale + 3);
      uVar7 = 0;
      do {
        uVar13 = (uint)(char)pbVar11[-3];
        uVar14 = (ulong)uVar13;
        if ((-1 < (int)uVar13) && ((int)uVar13 < table->ColumnsCount)) {
          pIVar5 = (table->Columns).Data + (int)uVar13;
          if ((table->Columns).DataEnd <= pIVar5) goto LAB_0015e4b5;
          uVar13 = p->SaveFlags;
          if ((uVar13 & 1) != 0) {
            *(undefined4 *)((long)&pIVar5->WidthRequest + (ulong)(*pbVar11 & 8)) =
                 *(undefined4 *)(pbVar11 + -0xb);
            pIVar5->AutoFitQueue = '\0';
          }
          if ((uVar13 & 2) != 0) {
            uVar14 = (ulong)pbVar11[-2];
          }
          pIVar5->DisplayOrder = (ImGuiTableColumnIdx)uVar14;
          uVar7 = uVar7 | 1L << (uVar14 & 0x3f);
          bVar12 = (bool)(*pbVar11 >> 2 & 1);
          pIVar5->IsEnabledNextFrame = bVar12;
          pIVar5->IsEnabled = bVar12;
          pIVar5->SortOrder = pbVar11[-1];
          pIVar5->field_0x64 = pIVar5->field_0x64 & 0xfc | *pbVar11 & 3;
        }
        uVar3 = uVar3 + 1;
        bVar4 = p->ColumnsCount;
        pbVar11 = pbVar11 + 0xc;
      } while ((int)uVar3 < (int)(char)bVar4);
      uVar3 = (uint)(bVar4 == 0x40);
    }
    uVar14 = ~(-1L << (bVar4 & 0x3f));
    if ((char)uVar3 != '\0') {
      uVar14 = 0xffffffffffffffff;
    }
    if ((uVar7 != uVar14) && (iVar2 = table->ColumnsCount, 0 < (long)iVar2)) {
      pIVar5 = (table->Columns).Data;
      lVar8 = 0;
      do {
        if ((table->Columns).DataEnd <= pIVar5) goto LAB_0015e4b5;
        pIVar5->DisplayOrder = (ImGuiTableColumnIdx)lVar8;
        lVar8 = lVar8 + 1;
        pIVar5 = pIVar5 + 1;
      } while (iVar2 != lVar8);
    }
    if (0 < table->ColumnsCount) {
      lVar8 = 0;
      lVar6 = 0;
      do {
        pIVar5 = (table->Columns).Data;
        if ((table->Columns).DataEnd <= (ImGuiTableColumn *)((long)&pIVar5->Flags + lVar8)) {
LAB_0015e4b5:
          pcVar10 = "T &ImSpan<ImGuiTableColumn>::operator[](int) [T = ImGuiTableColumn]";
LAB_0015e4e1:
          __assert_fail("p >= Data && p < DataEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_internal.h"
                        ,0x23b,pcVar10);
        }
        lVar9 = (long)(&pIVar5->DisplayOrder)[lVar8];
        if ((lVar9 < 0) ||
           (pcVar10 = (table->DisplayOrderToIndex).Data + lVar9,
           (table->DisplayOrderToIndex).DataEnd <= pcVar10)) {
          pcVar10 = "T &ImSpan<signed char>::operator[](int) [T = signed char]";
          goto LAB_0015e4e1;
        }
        *pcVar10 = (char)lVar6;
        lVar6 = lVar6 + 1;
        lVar8 = lVar8 + 0x68;
      } while (lVar6 < table->ColumnsCount);
    }
  }
  return;
}

Assistant:

void ImGui::TableLoadSettings(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    table->IsSettingsRequestLoad = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind settings
    ImGuiTableSettings* settings;
    if (table->SettingsOffset == -1)
    {
        settings = TableSettingsFindByID(table->ID);
        if (settings == NULL)
            return;
        if (settings->ColumnsCount != table->ColumnsCount) // Allow settings if columns count changed. We could otherwise decide to return...
            table->IsSettingsDirty = true;
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    else
    {
        settings = TableGetBoundSettings(table);
    }

    table->SettingsLoadedFlags = settings->SaveFlags;
    table->RefScale = settings->RefScale;

    // Serialize ImGuiTableSettings/ImGuiTableColumnSettings into ImGuiTable/ImGuiTableColumn
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();
    ImU64 display_order_mask = 0;
    for (int data_n = 0; data_n < settings->ColumnsCount; data_n++, column_settings++)
    {
        int column_n = column_settings->Index;
        if (column_n < 0 || column_n >= table->ColumnsCount)
            continue;

        ImGuiTableColumn* column = &table->Columns[column_n];
        if (settings->SaveFlags & ImGuiTableFlags_Resizable)
        {
            if (column_settings->IsStretch)
                column->StretchWeight = column_settings->WidthOrWeight;
            else
                column->WidthRequest = column_settings->WidthOrWeight;
            column->AutoFitQueue = 0x00;
        }
        if (settings->SaveFlags & ImGuiTableFlags_Reorderable)
            column->DisplayOrder = column_settings->DisplayOrder;
        else
            column->DisplayOrder = (ImGuiTableColumnIdx)column_n;
        display_order_mask |= (ImU64)1 << column->DisplayOrder;
        column->IsEnabled = column->IsEnabledNextFrame = column_settings->IsEnabled;
        column->SortOrder = column_settings->SortOrder;
        column->SortDirection = column_settings->SortDirection;
    }

    // Validate and fix invalid display order data
    const ImU64 expected_display_order_mask = (settings->ColumnsCount == 64) ? ~0 : ((ImU64)1 << settings->ColumnsCount) - 1;
    if (display_order_mask != expected_display_order_mask)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
            table->Columns[column_n].DisplayOrder = (ImGuiTableColumnIdx)column_n;

    // Rebuild index
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        table->DisplayOrderToIndex[table->Columns[column_n].DisplayOrder] = (ImGuiTableColumnIdx)column_n;
}